

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Condensation.cpp
# Opt level: O0

Clause * __thiscall Inferences::Condensation::simplify(Condensation *this,Clause *cl)

{
  bool bVar1;
  int iVar2;
  Literal **ppLVar3;
  Literal *pLVar4;
  Clause *in_RSI;
  uint i_1;
  InstanceIterator iit_1;
  Literal *lit_1;
  uint i;
  InstanceIterator iit;
  Literal *lit;
  uint next;
  bool success;
  RobSubstitution *subst;
  SubstIterator sit;
  RobSubstitution subst0;
  Literal *l2;
  Literal *l1;
  uint l2Index;
  uint l1Index;
  pair<unsigned_int,_unsigned_int> lpair;
  CombinationIterator<unsigned_int> pairIt;
  LiteralMiniIndex cmi;
  uint newLen;
  uint clen;
  uint in_stack_fffffffffffffd08;
  uint in_stack_fffffffffffffd0c;
  RobSubstitution *in_stack_fffffffffffffd10;
  Clause *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  uint in_stack_fffffffffffffd24;
  Clause *in_stack_fffffffffffffd28;
  RobSubstitution *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  uint in_stack_fffffffffffffd3c;
  Inference *in_stack_fffffffffffffd60;
  uint in_stack_fffffffffffffd6c;
  Literal *in_stack_fffffffffffffd70;
  Literal **in_stack_fffffffffffffd78;
  Literal *in_stack_fffffffffffffd80;
  RobSubstitution *in_stack_fffffffffffffd88;
  SimplifyingInference1 local_208;
  Inference local_1f8;
  uint local_1c4;
  Literal *local_1a0;
  uint local_194;
  Literal *local_170;
  uint local_168;
  byte local_161;
  undefined8 local_160;
  RobSubstitution *local_158;
  Literal *local_80;
  Literal *local_78;
  uint local_6c;
  uint local_68;
  pair<unsigned_int,_unsigned_int> local_64;
  CombinationIterator<unsigned_int> local_5c [5];
  uint local_20;
  uint local_1c;
  Clause *local_18;
  Clause *local_8;
  
  local_18 = in_RSI;
  local_1c = Kernel::Clause::length(in_RSI);
  if (local_1c < 2) {
    local_8 = local_18;
  }
  else {
    local_20 = local_1c - 1;
    if ((simplify(Kernel::Clause*)::newLits == '\0') &&
       (iVar2 = __cxa_guard_acquire(&simplify(Kernel::Clause*)::newLits), iVar2 != 0)) {
      Lib::DArray<Kernel::Literal_*>::DArray
                ((DArray<Kernel::Literal_*> *)
                 CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                 (size_t)in_stack_fffffffffffffd18);
      __cxa_atexit(Lib::DArray<Kernel::Literal_*>::~DArray,&simplify::newLits,&__dso_handle);
      __cxa_guard_release(&simplify(Kernel::Clause*)::newLits);
    }
    if ((simplify(Kernel::Clause*)::alts == '\0') &&
       (iVar2 = __cxa_guard_acquire(&simplify(Kernel::Clause*)::alts), iVar2 != 0)) {
      Lib::DArray<Lib::List<Kernel::Literal_*>_*>::DArray
                ((DArray<Lib::List<Kernel::Literal_*>_*> *)
                 CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                 (size_t)in_stack_fffffffffffffd18);
      __cxa_atexit(Lib::DArray<Lib::List<Kernel::Literal_*>_*>::~DArray,&simplify::alts,
                   &__dso_handle);
      __cxa_guard_release(&simplify(Kernel::Clause*)::alts);
    }
    Indexing::LiteralMiniIndex::LiteralMiniIndex
              ((LiteralMiniIndex *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    Lib::CombinationIterator<unsigned_int>::CombinationIterator
              ((CombinationIterator<unsigned_int> *)in_stack_fffffffffffffd10,
               in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08);
    do {
      do {
        bVar1 = Lib::CombinationIterator<unsigned_int>::hasNext(local_5c);
        if (!bVar1) {
          local_8 = local_18;
          goto LAB_0079972f;
        }
        local_64 = Lib::CombinationIterator<unsigned_int>::next
                             ((CombinationIterator<unsigned_int> *)
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        local_68 = local_64.first;
        local_6c = local_64.second;
      } while (local_64.first == local_64.second);
      ppLVar3 = Kernel::Clause::operator[](local_18,local_64.first);
      local_78 = *ppLVar3;
      ppLVar3 = Kernel::Clause::operator[](local_18,local_6c);
      local_80 = *ppLVar3;
      Lib::DArray<Kernel::Literal_*>::ensure
                ((DArray<Kernel::Literal_*> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (size_t)in_stack_fffffffffffffd30);
      Kernel::RobSubstitution::RobSubstitution(in_stack_fffffffffffffd30);
      in_stack_fffffffffffffd08 = 0;
      Kernel::RobSubstitution::unifiers
                ((RobSubstitution *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (Literal *)in_stack_fffffffffffffd30,
                 (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                 (Literal *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                 (int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffd18 >> 0x18,0));
      do {
        bVar1 = Lib::VirtualIterator<Kernel::RobSubstitution_*>::hasNext
                          ((VirtualIterator<Kernel::RobSubstitution_*> *)0x79917b);
        if (!bVar1) {
          bVar1 = false;
          goto LAB_007996cc;
        }
        local_158 = Lib::VirtualIterator<Kernel::RobSubstitution_*>::next
                              ((VirtualIterator<Kernel::RobSubstitution_*> *)0x7991a1);
        local_160 = 0;
        Lib::DArray<Lib::List<Kernel::Literal_*>_*>::init
                  (&simplify::alts,(EVP_PKEY_CTX *)(ulong)local_20);
        local_161 = 0;
        local_168 = 0;
        pLVar4 = Kernel::RobSubstitution::apply
                           (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                            (int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
        local_170 = pLVar4;
        ppLVar3 = Lib::DArray<Kernel::Literal_*>::operator[](&simplify::newLits,(ulong)local_168);
        *ppLVar3 = pLVar4;
        Indexing::LiteralMiniIndex::InstanceIterator::InstanceIterator
                  ((InstanceIterator *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                   ,(LiteralMiniIndex *)in_stack_fffffffffffffd18,
                   (Literal *)in_stack_fffffffffffffd10,SUB41(in_stack_fffffffffffffd0c >> 0x18,0));
        bVar1 = Indexing::LiteralMiniIndex::InstanceIterator::hasNext
                          ((InstanceIterator *)
                           CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        if (bVar1) {
          while (bVar1 = Indexing::LiteralMiniIndex::InstanceIterator::hasNext
                                   ((InstanceIterator *)
                                    CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)),
                bVar1) {
            Indexing::LiteralMiniIndex::InstanceIterator::next((InstanceIterator *)0x799319);
            Lib::DArray<Lib::List<Kernel::Literal_*>_*>::operator[]
                      (&simplify::alts,(ulong)local_168);
            Lib::List<Kernel::Literal_*>::push
                      ((Literal *)in_stack_fffffffffffffd10,
                       (List<Kernel::Literal_*> **)
                       CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          }
          local_168 = local_168 + 1;
          for (local_194 = 0; iVar2 = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
              local_194 < local_1c; local_194 = local_194 + 1) {
            if ((local_194 != local_68) && (local_194 != local_6c)) {
              in_stack_fffffffffffffd88 = local_158;
              Kernel::Clause::operator[](local_18,local_194);
              in_stack_fffffffffffffd70 =
                   Kernel::RobSubstitution::apply
                             (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,iVar2);
              in_stack_fffffffffffffd80 = in_stack_fffffffffffffd70;
              local_1a0 = in_stack_fffffffffffffd70;
              in_stack_fffffffffffffd78 =
                   Lib::DArray<Kernel::Literal_*>::operator[](&simplify::newLits,(ulong)local_168);
              *in_stack_fffffffffffffd78 = in_stack_fffffffffffffd70;
              Indexing::LiteralMiniIndex::InstanceIterator::InstanceIterator
                        ((InstanceIterator *)
                         CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                         (LiteralMiniIndex *)in_stack_fffffffffffffd18,
                         (Literal *)in_stack_fffffffffffffd10,
                         SUB41(in_stack_fffffffffffffd0c >> 0x18,0));
              bVar1 = Indexing::LiteralMiniIndex::InstanceIterator::hasNext
                                ((InstanceIterator *)
                                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
              in_stack_fffffffffffffd6c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd6c);
              if (!bVar1) goto LAB_00799582;
              while( true ) {
                bVar1 = Indexing::LiteralMiniIndex::InstanceIterator::hasNext
                                  ((InstanceIterator *)
                                   CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
                in_stack_fffffffffffffd6c =
                     CONCAT13((char)(in_stack_fffffffffffffd6c >> 0x18),
                              CONCAT12(bVar1,(short)in_stack_fffffffffffffd6c));
                if (!bVar1) break;
                in_stack_fffffffffffffd60 =
                     (Inference *)
                     Indexing::LiteralMiniIndex::InstanceIterator::next
                               ((InstanceIterator *)0x7994b4);
                Lib::DArray<Lib::List<Kernel::Literal_*>_*>::operator[]
                          (&simplify::alts,(ulong)local_168);
                Lib::List<Kernel::Literal_*>::push
                          ((Literal *)in_stack_fffffffffffffd10,
                           (List<Kernel::Literal_*> **)
                           CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
              }
              local_168 = local_168 + 1;
            }
          }
          Lib::DArray<Kernel::Literal_*>::array(&simplify::newLits);
          in_stack_fffffffffffffd3c = local_20;
          Lib::DArray<Lib::List<Kernel::Literal_*>_*>::array(&simplify::alts);
          local_161 = Kernel::MLMatcher::canBeMatched
                                ((Literal **)in_stack_fffffffffffffd30,
                                 (uint)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                                 (Clause *)
                                 CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                                 (LiteralList **)in_stack_fffffffffffffd18,
                                 (Literal *)in_stack_fffffffffffffd10,
                                 SUB41(in_stack_fffffffffffffd0c >> 0x18,0));
          in_stack_fffffffffffffd38 = CONCAT13(local_161,(int3)in_stack_fffffffffffffd38);
        }
LAB_00799582:
        for (local_1c4 = 0; local_1c4 < local_20; local_1c4 = local_1c4 + 1) {
          in_stack_fffffffffffffd30 =
               (RobSubstitution *)
               Lib::DArray<Lib::List<Kernel::Literal_*>_*>::operator[]
                         (&simplify::alts,(ulong)local_1c4);
          Lib::List<Kernel::Literal_*>::destroy
                    ((List<Kernel::Literal_*> *)
                     CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
        }
      } while ((local_161 & 1) == 0);
      *(int *)(DAT_01333840 + 0x16c) = *(int *)(DAT_01333840 + 0x16c) + 1;
      in_stack_fffffffffffffd28 =
           (Clause *)Lib::DArray<Kernel::Literal_*>::begin(&simplify::newLits);
      in_stack_fffffffffffffd24 = local_20;
      Kernel::SimplifyingInference1::SimplifyingInference1(&local_208,CONDENSATION,local_18);
      Kernel::Inference::Inference
                ((Inference *)in_stack_fffffffffffffd10,
                 (SimplifyingInference1 *)
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      in_stack_fffffffffffffd18 =
           Kernel::Clause::fromArray
                     ((Literal **)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                      in_stack_fffffffffffffd60);
      local_8 = in_stack_fffffffffffffd18;
      Kernel::Inference::~Inference(&local_1f8);
      bVar1 = true;
LAB_007996cc:
      Lib::VirtualIterator<Kernel::RobSubstitution_*>::~VirtualIterator
                ((VirtualIterator<Kernel::RobSubstitution_*> *)in_stack_fffffffffffffd10);
      Kernel::RobSubstitution::~RobSubstitution(in_stack_fffffffffffffd10);
    } while (!bVar1);
LAB_0079972f:
    Indexing::LiteralMiniIndex::~LiteralMiniIndex((LiteralMiniIndex *)0x79973c);
  }
  return local_8;
}

Assistant:

Clause* Condensation::simplify(Clause* cl)
{
  TIME_TRACE("condensation");

  unsigned clen=cl->length();
  if(clen<=1) {
    return cl;
  }
  unsigned newLen=clen-1;

  // stores newLen new literals
  static DArray<Literal*> newLits(32);
  //
  static DArray<LiteralList*> alts(32);

  LiteralMiniIndex cmi(cl);

  // For each pair of non-equal literals l1 and l2
  //
  CombinationIterator<unsigned> pairIt(0, clen);
  while(pairIt.hasNext()) {
    pair<unsigned,unsigned> lpair=pairIt.next();
    unsigned l1Index=lpair.first;
    unsigned l2Index=lpair.second;
    if(l1Index==l2Index) {
      continue;
    }
    Literal* l1=(*cl)[l1Index];
    Literal* l2=(*cl)[l2Index];

    newLits.ensure(newLen);

    RobSubstitution subst0;
    // For each unifying subst of l1 and l2
    // apply the subst to l1 and search for instances of this in the clause
    // (note that this is symmetric to applying subst to l2)
    SubstIterator sit=subst0.unifiers(l1,0,l2,0,false);
    while(sit.hasNext()) {
      RobSubstitution* subst=sit.next();
      alts.init(newLen,0);
      bool success=false;

      unsigned next=0;
      {
        Literal* lit=subst->apply(l1,0);
        newLits[next] = lit;
        // Use lit as a query to find instances of it in cmi (i.e. the clause)
        LiteralMiniIndex::InstanceIterator iit(cmi, lit, false);
        if(!iit.hasNext()) {
          // If there are no instances then finish
          goto match_fin;
        }
        // Store all instances in alts (alts[next] is a literal list)
        while(iit.hasNext()) {
	    LiteralList::push(iit.next(), alts[next]);
        }
        next++;
      }

      // For all literals that are not l1 or l2
      // apply the subst and search for instances of the result as before
      for(unsigned i=0;i<clen;i++) {
        if(i!=l1Index && i!=l2Index) {
          Literal* lit=subst->apply((*cl)[i],0);
          newLits[next] = lit;
          LiteralMiniIndex::InstanceIterator iit(cmi, lit, false);
          if(!iit.hasNext()) {
            goto match_fin;
          }
          while(iit.hasNext()) {
	    LiteralList::push(iit.next(), alts[next]);
          }
          next++;
        }
      }

      // I think this is asking if there is a substitution that will match
      // each lit in newLits with one of its instances in alts
      // CHECK!
      success=MLMatcher::canBeMatched(newLits.array(), newLen, cl,alts.array(),0,false);

    // We will jump here if we do not find a match, in this case success will be false
    match_fin:
      for(unsigned i=0;i<newLen;i++) {
        LiteralList::destroy(alts[i]);
      }

      if(success) {
        env.statistics->condensations++;
        return Clause::fromArray(newLits.begin(), newLen, SimplifyingInference1(InferenceRule::CONDENSATION, cl));
      }
    }
  }
  return cl;
}